

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

void __thiscall
cmsys::Glob::ProcessDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  bool bVar1;
  ulong uVar2;
  unsigned_long uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  Directory d;
  string realname;
  string fname;
  Directory local_d8;
  size_type local_d0;
  string local_c8;
  size_type local_a8;
  GlobMessages *local_a0;
  long local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = ((long)(this->Internals->Expressions).
                 super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->Internals->Expressions).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xd0;
  local_d0 = uVar2 - 1;
  if ((local_d0 == start) && (this->Recurse == true)) {
    RecurseDirectory(this,start,dir,messages);
    return;
  }
  if (start < uVar2) {
    Directory::Directory(&local_d8);
    bVar1 = Directory::Load(&local_d8,dir);
    if (bVar1) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_90.field_2._M_local_buf[0] = '\0';
      local_a8 = start + 1;
      local_98 = start * 0xd0;
      local_a0 = messages;
      for (uVar2 = 0; uVar3 = Directory::GetNumberOfFiles(&local_d8), uVar2 < uVar3;
          uVar2 = uVar2 + 1) {
        Directory::GetFile(&local_d8,uVar2);
        std::__cxx11::string::assign((char *)&local_90);
        bVar1 = std::operator==(&local_90,".");
        if ((!bVar1) && (bVar1 = std::operator==(&local_90,".."), !bVar1)) {
          if (start == 0) {
            __return_storage_ptr__ = &local_50;
            std::operator+(__return_storage_ptr__,dir,&local_90);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)__return_storage_ptr__);
          }
          else {
            __return_storage_ptr__ = &local_70;
            std::operator+(__return_storage_ptr__,dir,"/");
            std::operator+(&local_50,__return_storage_ptr__,&local_90);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          if (local_d0 == start) {
            if ((this->ListDirs != false) ||
               (bVar1 = SystemTools::FileIsDirectory(&local_c8), !bVar1)) {
LAB_00377177:
              bVar1 = RegularExpression::find
                                ((RegularExpression *)
                                 ((long)(((this->Internals->Expressions).
                                          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->regmatch).
                                        startp + local_98),local_90._M_dataplus._M_p);
              if (bVar1) {
                if (local_d0 == start) {
                  AddFile(this,&this->Internals->Files,&local_c8);
                }
                else {
                  ProcessDirectory(this,local_a8,&local_c8,local_a0);
                }
              }
            }
          }
          else {
            bVar1 = SystemTools::FileIsDirectory(&local_c8);
            if (bVar1) goto LAB_00377177;
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    Directory::~Directory(&local_d8);
  }
  return;
}

Assistant:

void Glob::ProcessDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  // std::cout << "ProcessDirectory: " << dir << std::endl;
  bool last = (start == this->Internals->Expressions.size() - 1);
  if (last && this->Recurse) {
    this->RecurseDirectory(start, dir, messages);
    return;
  }

  if (start >= this->Internals->Expressions.size()) {
    return;
  }

  kwsys::Directory d;
  if (!d.Load(dir)) {
    return;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On case-insensitive file systems convert to lower case for matching.
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    // std::cout << "Look at file: " << fname << std::endl;
    // std::cout << "Match: "
    // << this->Internals->TextExpressions[start].c_str() << std::endl;
    // std::cout << "Real name: " << realname << std::endl;

    if ((!last && !kwsys::SystemTools::FileIsDirectory(realname)) ||
        (!this->ListDirs && last &&
         kwsys::SystemTools::FileIsDirectory(realname))) {
      continue;
    }

    if (this->Internals->Expressions[start].find(fname)) {
      if (last) {
        this->AddFile(this->Internals->Files, realname);
      } else {
        this->ProcessDirectory(start + 1, realname, messages);
      }
    }
  }
}